

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status
ghc::filesystem::detail::status_ex
          (path *p,error_code *ec,file_status *sls,uintmax_t *sz,uintmax_t *nhl,time_t *lwt,
          int recurse_count)

{
  bool bVar1;
  file_type fVar2;
  value_type *pvVar3;
  file_status *in_RCX;
  undefined8 *in_RDX;
  file_status in_RDI;
  __off_t *in_R8;
  __nlink_t *in_R9;
  error_code eVar4;
  __time_t *in_stack_00000008;
  file_status fs;
  int result;
  stat st;
  file_status fVar5;
  undefined4 uStack_fc;
  undefined4 uStack_e4;
  file_status local_d4;
  file_status local_cc;
  int local_c4;
  stat local_c0;
  __nlink_t *local_30;
  __off_t *local_28;
  file_status *local_20;
  undefined8 *local_18;
  
  fVar5 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::error_code::clear((error_code *)in_RDI);
  pvVar3 = path::c_str((path *)0x1d112d);
  local_c4 = lstat(pvVar3,&local_c0);
  if (local_c4 != 0) {
    eVar4 = make_system_error(in_RDI._4_4_);
    *local_18 = CONCAT44(uStack_fc,eVar4._M_value);
    local_18[1] = eVar4._M_cat;
    bVar1 = is_not_found_error((error_code *)in_RDI);
    if (!bVar1) {
      file_status::file_status((file_status *)in_RDI,none,unknown);
      return fVar5;
    }
    file_status::file_status((file_status *)in_RDI,not_found,unknown);
    return fVar5;
  }
  std::error_code::clear((error_code *)in_RDI);
  file_status_from_st_mode<unsigned_int>(fVar5._4_4_);
  if (local_20 != (file_status *)0x0) {
    file_status::operator=(local_20,&local_cc);
  }
  fVar2 = file_status::type(&local_cc);
  if (fVar2 == symlink) {
    pvVar3 = path::c_str((path *)0x1d11a3);
    local_c4 = stat(pvVar3,&local_c0);
    if (local_c4 != 0) {
      eVar4 = make_system_error(in_RDI._4_4_);
      *local_18 = CONCAT44(uStack_e4,eVar4._M_value);
      local_18[1] = eVar4._M_cat;
      bVar1 = is_not_found_error((error_code *)in_RDI);
      if (bVar1) {
        file_status::file_status((file_status *)in_RDI,not_found,unknown);
      }
      else {
        file_status::file_status((file_status *)in_RDI,none,unknown);
      }
      goto LAB_001d12ce;
    }
    file_status_from_st_mode<unsigned_int>(fVar5._4_4_);
    file_status::operator=(&local_cc,&local_d4);
    file_status::~file_status(&local_d4);
  }
  if (local_28 != (__off_t *)0x0) {
    *local_28 = local_c0.st_size;
  }
  if (local_30 != (__nlink_t *)0x0) {
    *local_30 = local_c0.st_nlink;
  }
  if (in_stack_00000008 != (__time_t *)0x0) {
    *in_stack_00000008 = local_c0.st_mtim.tv_sec;
  }
  file_status::file_status((file_status *)in_RDI,&local_cc);
LAB_001d12ce:
  file_status::~file_status(&local_cc);
  return fVar5;
}

Assistant:

GHC_INLINE file_status status_ex(const path& p, std::error_code& ec, file_status* sls = nullptr, uintmax_t* sz = nullptr, uintmax_t* nhl = nullptr, time_t* lwt = nullptr, int recurse_count = 0) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (recurse_count > 16) {
        ec = detail::make_system_error(0x2A9 /*ERROR_STOPPED_ON_SYMLINK*/);
        return file_status(file_type::unknown);
    }
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!::GetFileAttributesExW(GHC_NATIVEWP(p), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
    }
    else if (attr.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) {
        auto reparseData = detail::getReparseData(p, ec);
        if (!ec && reparseData && IsReparseTagMicrosoft(reparseData->ReparseTag) && reparseData->ReparseTag == IO_REPARSE_TAG_SYMLINK) {
            path target = resolveSymlink(p, ec);
            file_status result;
            if (!ec && !target.empty()) {
                if (sls) {
                    *sls = status_from_INFO(p, &attr, ec);
                }
                return detail::status_ex(target, ec, nullptr, sz, nhl, lwt, recurse_count + 1);
            }
            return file_status(file_type::unknown);
        }
    }
    if (ec) {
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found);
        }
        return file_status(file_type::none);
    }
    if (nhl) {
        *nhl = 0;
    }
    return detail::status_from_INFO(p, &attr, ec, sz, lwt);
#else
    (void)recurse_count;
    struct ::stat st;
    auto result = ::lstat(p.c_str(), &st);
    if (result == 0) {
        ec.clear();
        file_status fs = detail::file_status_from_st_mode(st.st_mode);
        if (sls) {
            *sls = fs;
        }
        if (fs.type() == file_type::symlink) {
            result = ::stat(p.c_str(), &st);
            if (result == 0) {
                fs = detail::file_status_from_st_mode(st.st_mode);
            }
            else {
                ec = detail::make_system_error();
                if (detail::is_not_found_error(ec)) {
                    return file_status(file_type::not_found, perms::unknown);
                }
                return file_status(file_type::none);
            }
        }
        if (sz) {
            *sz = static_cast<uintmax_t>(st.st_size);
        }
        if (nhl) {
            *nhl = st.st_nlink;
        }
        if (lwt) {
            *lwt = st.st_mtime;
        }
        return fs;
    }
    else {
        ec = detail::make_system_error();
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found, perms::unknown);
        }
        return file_status(file_type::none);
    }
#endif
}